

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_impl.cc
# Opt level: O2

Impl * absl::time_internal::cctz::time_zone::Impl::UTCImpl(void)

{
  int iVar1;
  Impl *this;
  allocator<char> local_31;
  string local_30;
  
  if (UTCImpl()::utc_impl == '\0') {
    iVar1 = __cxa_guard_acquire(&UTCImpl()::utc_impl);
    if (iVar1 != 0) {
      this = (Impl *)operator_new(0x28);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"UTC",&local_31);
      Impl(this,&local_30);
      std::__cxx11::string::~string((string *)&local_30);
      UTCImpl::utc_impl = this;
      __cxa_guard_release(&UTCImpl()::utc_impl);
    }
  }
  return UTCImpl::utc_impl;
}

Assistant:

const time_zone::Impl* time_zone::Impl::UTCImpl() {
  static const Impl* utc_impl = new Impl("UTC");  // never fails
  return utc_impl;
}